

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

int ON_SN_BLOCK::CompareMaxSN(void *a,void *b)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = *(ulong *)(*a + 0x18);
  uVar2 = *(ulong *)(*b + 0x18);
  if (uVar1 < uVar2) {
    bVar3 = uVar1 != 0;
  }
  else {
    if (uVar1 <= uVar2) {
      return 0;
    }
    bVar3 = uVar2 == 0;
  }
  return -(uint)bVar3 | 1;
}

Assistant:

int ON_SN_BLOCK::CompareMaxSN(const void* a, const void* b)
{
  const ON__UINT64 sna = (*((const ON_SN_BLOCK*const*)a))->m_sn1;
  const ON__UINT64 snb = (*((const ON_SN_BLOCK*const*)b))->m_sn1;
  if ( sna < snb )
  {
    return (0 == sna) ? 1 : -1;
  }
  if ( snb < sna )
  {
    return (0 == snb) ? -1 : 1;
  }
  return 0;
}